

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::~SchemaLoader(SchemaLoader *this)

{
  if ((this->impl).value.ptr != (Impl *)0x0) {
    (this->impl).value.ptr = (Impl *)0x0;
    (*(code *)**(undefined8 **)(this->impl).value.disposer)();
  }
  kj::_::Mutex::~Mutex((Mutex *)this);
  return;
}

Assistant:

SchemaLoader::~SchemaLoader() noexcept(false) {}